

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O0

void rngInit(void)

{
  bool_t bVar1;
  _func_void_varargs *in_stack_00000018;
  
  bVar1 = mtMtxCreate((mt_mtx_t *)0x11d24d);
  if (bVar1 != 0) {
    bVar1 = utilOnExit(in_stack_00000018);
    if (bVar1 == 0) {
      mtMtxClose((mt_mtx_t *)0x11d271);
    }
    else {
      _inited = 1;
    }
  }
  return;
}

Assistant:

static void rngInit()
{
	ASSERT(!_inited);
	// создать мьютекс
	if (!mtMtxCreate(_mtx))
		return;
	// зарегистрировать деструктор
	if (!utilOnExit(rngDestroy))
	{
		mtMtxClose(_mtx);
		return;
	}
	_inited = TRUE;
}